

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_relocation.hpp
# Opt level: O0

bool __thiscall
ELFIO::relocation_section_accessor_template<ELFIO::section>::generic_get_entry_rel<ELFIO::Elf64_Rel>
          (relocation_section_accessor_template<ELFIO::section> *this,Elf_Xword index,
          Elf64_Addr *offset,Elf_Word *symbol,uint *type,Elf_Sxword *addend)

{
  int iVar1;
  int iVar2;
  Elf_Word EVar3;
  uint uVar4;
  endianness_convertor *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  uint64_t *puVar5;
  uint64_t uVar6;
  bool bVar7;
  Elf_Xword tmp;
  Elf64_Rel *pEntry;
  endianness_convertor *convertor;
  Elf_Sxword *addend_local;
  uint *type_local;
  Elf_Word *symbol_local;
  Elf64_Addr *offset_local;
  Elf_Xword index_local;
  relocation_section_accessor_template<ELFIO::section> *this_local;
  
  this_00 = elfio::get_convertor(this->elf_file);
  iVar1 = (*this->relocation_section->_vptr_section[0xf])();
  bVar7 = 0xf < CONCAT44(extraout_var,iVar1);
  if (bVar7) {
    iVar1 = (*this->relocation_section->_vptr_section[0x18])();
    iVar2 = (*this->relocation_section->_vptr_section[0xf])();
    puVar5 = (uint64_t *)(CONCAT44(extraout_var_00,iVar1) + index * CONCAT44(extraout_var_01,iVar2))
    ;
    uVar6 = endianness_convertor::operator()(this_00,*puVar5);
    *offset = uVar6;
    uVar6 = endianness_convertor::operator()(this_00,puVar5[1]);
    EVar3 = get_sym_and_type<ELFIO::Elf64_Rel>::get_r_sym(uVar6);
    *symbol = EVar3;
    uVar4 = get_sym_and_type<ELFIO::Elf64_Rel>::get_r_type(uVar6);
    *type = uVar4;
    *addend = 0;
  }
  return bVar7;
}

Assistant:

bool generic_get_entry_rel( Elf_Xword   index,
                                Elf64_Addr& offset,
                                Elf_Word&   symbol,
                                unsigned&   type,
                                Elf_Sxword& addend ) const
    {
        const endianness_convertor& convertor = elf_file.get_convertor();

        if ( relocation_section->get_entry_size() < sizeof( T ) ) {
            return false;
        }
        const T* pEntry = reinterpret_cast<const T*>(
            relocation_section->get_data() +
            index * relocation_section->get_entry_size() );
        offset        = convertor( pEntry->r_offset );
        Elf_Xword tmp = convertor( pEntry->r_info );
        symbol        = get_sym_and_type<T>::get_r_sym( tmp );
        type          = get_sym_and_type<T>::get_r_type( tmp );
        addend        = 0;
        return true;
    }